

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg,char *pass,bool check_all,bool check_relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  string *psVar3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_00;
  reference ppcVar4;
  ulong uVar5;
  char *comment;
  bool local_1f3;
  bool local_1f2;
  string local_1a0 [8];
  string doc;
  undefined1 local_158 [8];
  string subdir;
  cmStateSnapshot *c;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_108;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *local_f0;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *__range1_1;
  string tname;
  string local_c0;
  TargetType local_9c;
  cmGeneratorTarget *pcStack_98;
  int type;
  cmGeneratorTarget *gtarget;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_50 [8];
  string makeTarget;
  bool check_relink_local;
  bool check_all_local;
  char *pass_local;
  cmLocalUnixMakefileGenerator3 *lg_local;
  ostream *ruleFileStream_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  makeTarget.field_2._M_local_buf[0xe] = check_relink;
  makeTarget.field_2._M_local_buf[0xf] = check_all;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
  std::__cxx11::string::string((string *)local_50,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_50,'/');
  std::__cxx11::string::operator+=((string *)local_50,pass);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  this_00 = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)lg);
  __end1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_00);
  gtarget = (cmGeneratorTarget *)
            std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                *)&gtarget);
    if (!bVar2) {
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&__begin1_1,(cmLocalGenerator *)lg);
      cmStateSnapshot::GetChildren(&local_108,(cmStateSnapshot *)&__begin1_1);
      local_f0 = &local_108;
      __end1_1 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin(local_f0);
      c = (cmStateSnapshot *)
          std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end(local_f0);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                                 *)&c), bVar2) {
        subdir.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
             ::operator*(&__end1_1);
        cmStateSnapshot::GetDirectory
                  ((cmStateDirectory *)((long)&doc.field_2 + 8),
                   (cmStateSnapshot *)subdir.field_2._8_8_);
        psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_
                           ((cmStateDirectory *)((long)&doc.field_2 + 8));
        std::__cxx11::string::string((string *)local_158,(string *)psVar3);
        std::__cxx11::string::operator+=((string *)local_158,'/');
        std::__cxx11::string::operator+=((string *)local_158,pass);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,(value_type *)local_158);
        std::__cxx11::string::~string((string *)local_158);
        __gnu_cxx::
        __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
        ::operator++(&__end1_1);
      }
      std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector(&local_108);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
      if ((bVar2) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,&this->EmptyRuleHackDepends);
      }
      std::__cxx11::string::string(local_1a0);
      bVar2 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg);
      if (bVar2) {
        std::__cxx11::string::operator=(local_1a0,"The main recursive \"");
        std::__cxx11::string::operator+=(local_1a0,pass);
        std::__cxx11::string::operator+=(local_1a0,"\" target.");
      }
      else {
        std::__cxx11::string::operator=(local_1a0,"Recursive \"");
        std::__cxx11::string::operator+=(local_1a0,pass);
        std::__cxx11::string::operator+=(local_1a0,"\" directory target.");
      }
      comment = (char *)std::__cxx11::string::c_str();
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,comment,(string *)local_50,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1,commands,true,false);
      std::__cxx11::string::~string(local_1a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1);
      std::__cxx11::string::~string((string *)local_50);
      return;
    }
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    pcStack_98 = *ppcVar4;
    local_9c = cmGeneratorTarget::GetType(pcStack_98);
    pcVar1 = pcStack_98;
    if ((((local_9c == EXECUTABLE) || (local_9c == STATIC_LIBRARY)) || (local_9c == SHARED_LIBRARY))
       || (((local_9c == MODULE_LIBRARY || (local_9c == OBJECT_LIBRARY)) || (local_9c == UTILITY))))
    {
      tname.field_2._M_local_buf[0xe] = '\0';
      tname.field_2._M_local_buf[0xd] = '\0';
      if ((makeTarget.field_2._M_local_buf[0xf] & 1U) == 0) {
LAB_00531222:
        pcVar1 = pcStack_98;
        local_1f3 = true;
        if ((makeTarget.field_2._M_local_buf[0xe] & 1U) != 0) {
          psVar3 = cmLocalCommonGenerator::GetConfigName_abi_cxx11_
                             (&lg->super_cmLocalCommonGenerator);
          local_1f3 = cmGeneratorTarget::NeedRelinkBeforeInstall(pcVar1,psVar3);
        }
        local_1f2 = local_1f3;
      }
      else {
        std::allocator<char>::allocator();
        tname.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"EXCLUDE_FROM_ALL",
                   (allocator<char> *)(tname.field_2._M_local_buf + 0xf));
        tname.field_2._M_local_buf[0xd] = '\x01';
        bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_c0);
        local_1f2 = false;
        if (!bVar2) goto LAB_00531222;
      }
      if ((tname.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_c0);
      }
      if ((tname.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(tname.field_2._M_local_buf + 0xf));
      }
      if (local_1f2 != false) {
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  ((string *)&__range1_1,lg,pcStack_98);
        std::__cxx11::string::operator+=((string *)&__range1_1,"/");
        std::__cxx11::string::operator+=((string *)&__range1_1,pass);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,(value_type *)&__range1_1);
        std::__cxx11::string::~string((string *)&__range1_1);
      }
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg,
  const char* pass, bool check_all, bool check_relink,
  std::vector<std::string> const& commands)
{
  // Get the relative path to the subdirectory from the top.
  std::string makeTarget = lg->GetCurrentBinaryDirectory();
  makeTarget += '/';
  makeTarget += pass;

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  for (cmGeneratorTarget* gtarget : lg->GetGeneratorTargets()) {
    int type = gtarget->GetType();
    if ((type == cmStateEnums::EXECUTABLE) ||
        (type == cmStateEnums::STATIC_LIBRARY) ||
        (type == cmStateEnums::SHARED_LIBRARY) ||
        (type == cmStateEnums::MODULE_LIBRARY) ||
        (type == cmStateEnums::OBJECT_LIBRARY) ||
        (type == cmStateEnums::UTILITY)) {
      // Add this to the list of depends rules in this directory.
      if ((!check_all || !gtarget->GetPropertyAsBool("EXCLUDE_FROM_ALL")) &&
          (!check_relink ||
           gtarget->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
        std::string tname = lg->GetRelativeTargetDirectory(gtarget);
        tname += "/";
        tname += pass;
        depends.push_back(std::move(tname));
      }
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  for (cmStateSnapshot const& c : lg->GetStateSnapshot().GetChildren()) {
    std::string subdir = c.GetDirectory().GetCurrentBinary();
    subdir += '/';
    subdir += pass;
    depends.push_back(std::move(subdir));
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && !this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc;
  if (lg->IsRootMakefile()) {
    doc = "The main recursive \"";
    doc += pass;
    doc += "\" target.";
  } else {
    doc = "Recursive \"";
    doc += pass;
    doc += "\" directory target.";
  }
  lg->WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends, commands,
                    true);
}